

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_impl.c
# Opt level: O1

plugin plugin_create(char *name,plugin_descriptor descriptor,void *iface,void *impl,
                    _func_void_plugin *dtor)

{
  size_t sVar1;
  plugin p;
  undefined8 uVar2;
  char *pcVar3;
  ulong __size;
  
  if (name == (char *)0x0) {
    pcVar3 = "Invalid plugin name";
    uVar2 = 0x2e;
  }
  else {
    sVar1 = strlen(name);
    __size = sVar1 + 1;
    if (__size < 2) {
      pcVar3 = "Invalid plugin name length";
      uVar2 = 0x36;
    }
    else {
      p = (plugin)malloc(0x28);
      if (p != (plugin)0x0) {
        p->descriptor = descriptor;
        p->iface = iface;
        p->impl = impl;
        p->dtor = dtor;
        pcVar3 = (char *)malloc(__size);
        p->name = pcVar3;
        if (pcVar3 != (char *)0x0) {
          memcpy(pcVar3,name,__size);
          return p;
        }
        log_write_impl_va("metacall",0x4a,"plugin_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_impl.c"
                          ,3,"Invalid plugin name allocation");
        plugin_destroy(p);
        return (plugin)0x0;
      }
      pcVar3 = "Invalid plugin allocation";
      uVar2 = 0x3e;
    }
  }
  log_write_impl_va("metacall",uVar2,"plugin_create",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_impl.c"
                    ,3,pcVar3);
  return (plugin)0x0;
}

Assistant:

plugin plugin_create(const char *name, plugin_descriptor descriptor, void *iface, void *impl, void (*dtor)(plugin))
{
	if (name == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin name");
		return NULL;
	}

	size_t name_size = strlen(name) + 1;

	if (name_size <= 1)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin name length");
		return NULL;
	}

	plugin p = malloc(sizeof(struct plugin_type));

	if (p == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin allocation");
		return NULL;
	}

	p->descriptor = descriptor;
	p->iface = iface;
	p->impl = impl;
	p->dtor = dtor;
	p->name = malloc(sizeof(char) * name_size);

	if (p->name == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin name allocation");
		plugin_destroy(p);
		return NULL;
	}

	memcpy(p->name, name, name_size);

	return p;
}